

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O2

void __thiscall
CMU462::Timeline::drawRectangle(Timeline *this,double x1,double y1,double x2,double y2)

{
  glBegin(7);
  glVertex3f((float)x1,(float)y1,0);
  glVertex3f((float)x1,(float)y2,0);
  glVertex3f((float)x2,(float)y2,0);
  glVertex3f((float)x2,(float)y1,0);
  glEnd();
  return;
}

Assistant:

void Timeline::drawRectangle(double x1, double y1, double x2, double y2)
  {
	  float z = 0.0;

	  glBegin(GL_QUADS);

	  glVertex3f(x1, y1, z);
	  glVertex3f(x1, y2, z);
	  glVertex3f(x2, y2, z);
	  glVertex3f(x2, y1, z);
	  glEnd();
  }